

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O2

self_ * __thiscall standards::exp_number<double>::operator*=(exp_number<double> *this,self_ *rhs)

{
  double dVar1;
  
  dVar1 = rhs->log_ + this->log_;
  this->log_ = dVar1;
  this->sign_ = this->sign_ * rhs->sign_;
  if (ABS(dVar1 / rhs->log_) < 1e-10) {
    this->log_ = 0.0;
  }
  return this;
}

Assistant:

self_& operator*=(self_ const& rhs) {
    log_ += rhs.log_;
    sign_ *= rhs.sign_;
    if (std::abs(log_/rhs.log_) < 1.0e-10) log_ = 0;
    return *this;
  }